

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::Int64ToStringMap::ByteSizeLong(Int64ToStringMap *this)

{
  bool bVar1;
  int iVar2;
  Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pMVar3;
  const_pointer key;
  const_pointer pvVar4;
  size_t sVar5;
  long lVar6;
  undefined1 local_50 [4];
  int cached_size;
  undefined1 local_38 [8];
  const_iterator it;
  size_t sStack_18;
  uint32_t cached_has_bits;
  size_t total_size;
  Int64ToStringMap *this_local;
  
  it.it_.bucket_index_._4_4_ = 0;
  iVar2 = _internal_map_size(this);
  sStack_18 = google::protobuf::internal::FromIntSize(iVar2);
  pMVar3 = _internal_map_abi_cxx11_(this);
  google::protobuf::
  Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::begin
            ((const_iterator *)local_38,pMVar3);
  while( true ) {
    pMVar3 = _internal_map_abi_cxx11_(this);
    google::protobuf::
    Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::end
              ((const_iterator *)local_50,pMVar3);
    bVar1 = google::protobuf::operator!=((const_iterator *)local_38,(const_iterator *)local_50);
    if (!bVar1) break;
    key = google::protobuf::
          Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::const_iterator::operator->((const_iterator *)local_38);
    pvVar4 = google::protobuf::
             Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::const_iterator::operator->((const_iterator *)local_38);
    sVar5 = google::protobuf::internal::
            MapEntryFuncs<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)9>
            ::ByteSizeLong((long *)key,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (pvVar4 + 8));
    sStack_18 = sVar5 + sStack_18;
    google::protobuf::
    Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    const_iterator::operator++((const_iterator *)local_38);
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    lVar6 = std::__cxx11::string::size();
    sStack_18 = lVar6 + sStack_18;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_18);
  SetCachedSize(this,iVar2);
  return sStack_18;
}

Assistant:

size_t Int64ToStringMap::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.Int64ToStringMap)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // map<int64, string> map = 1;
  total_size += 1 *
      ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(this->_internal_map_size());
  for (::PROTOBUF_NAMESPACE_ID::Map< int64_t, std::string >::const_iterator
      it = this->_internal_map().begin();
      it != this->_internal_map().end(); ++it) {
    total_size += Int64ToStringMap_MapEntry_DoNotUse::Funcs::ByteSizeLong(it->first, it->second);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}